

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashUtils.hpp
# Opt level: O3

size_t Diligent::ComputeHashRaw(void *pData,size_t Size)

{
  uint *puVar1;
  uint uVar2;
  uint *puVar3;
  uint *puVar4;
  bool bVar5;
  undefined8 in_RCX;
  char (*Args_1) [21];
  ulong uVar6;
  uint *puVar7;
  ulong uVar8;
  uint32_t Val32;
  ulong uVar9;
  string msg;
  string local_50;
  
  puVar1 = (uint *)((long)pData + Size);
  puVar7 = (uint *)((long)pData + 3U & 0xfffffffffffffffc);
  bVar5 = puVar7 <= pData || (long)Size < 1;
  Args_1 = (char (*) [21])CONCAT71((int7)((ulong)in_RCX >> 8),bVar5);
  if (bVar5) {
    uVar9 = 0;
    uVar6 = 0;
  }
  else {
    uVar9 = 0;
    uVar6 = 0;
    puVar3 = (uint *)((long)pData + 1);
    do {
      Args_1 = (char (*) [21])(uVar6 & 0xffffffff);
      uVar9 = (ulong)*(byte *)((long)puVar3 + -1) << ((byte)Args_1 & 0x3f) | uVar9;
      uVar6 = uVar6 + 8;
      if (puVar1 <= puVar3) break;
      bVar5 = puVar3 < puVar7;
      puVar3 = (uint *)((long)puVar3 + 1);
    } while (bVar5);
    if (0x18 < uVar6) {
      FormatString<char[26],char[12]>
                (&local_50,(Diligent *)"Debug expression failed:\n",(char (*) [26])"Shift <= 24",
                 (char (*) [12])Args_1);
      Args_1 = (char (*) [21])0x9e;
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"ComputeHashRaw",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/HashUtils.hpp"
                 ,0x9e);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if (puVar1 < puVar7 + 1) {
    uVar8 = 0;
  }
  else {
    uVar8 = 0;
    puVar3 = puVar7;
    do {
      uVar9 = (ulong)*puVar3 << ((byte)uVar6 & 0x3f) | uVar9;
      uVar2 = (int)uVar9 * 0x1001;
      uVar2 = (uVar2 >> 0x16 ^ uVar2) * 0x11;
      uVar2 = (uVar2 >> 9 ^ uVar2) * 0x401;
      Args_1 = (char (*) [21])(ulong)((uVar2 >> 2 ^ uVar2) * 0x81081);
      uVar8 = uVar8 * 0x40 + 0x9e3779b9 + (uVar8 >> 2) + (long)Args_1 ^ uVar8;
      uVar9 = uVar9 >> 0x20;
      puVar7 = puVar3 + 1;
      puVar4 = puVar3 + 2;
      puVar3 = puVar7;
    } while (puVar4 <= puVar1);
  }
  for (; puVar7 < puVar1; puVar7 = (uint *)((long)puVar7 + 1)) {
    Args_1 = (char (*) [21])(uVar6 & 0xffffffff);
    uVar9 = uVar9 | (ulong)(byte)*puVar7 << ((byte)Args_1 & 0x3f);
    uVar6 = uVar6 + 8;
  }
  if (uVar6 < 0x31) {
    if (uVar6 == 0) {
      return uVar8;
    }
  }
  else {
    FormatString<char[26],char[21]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Shift <= (3 + 3) * 8",Args_1);
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"ComputeHashRaw",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/HashUtils.hpp"
               ,0xaf);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  uVar6 = uVar6 + 0x20;
  do {
    uVar2 = (int)uVar9 * 0x1001;
    uVar2 = (uVar2 >> 0x16 ^ uVar2) * 0x11;
    uVar2 = (uVar2 >> 9 ^ uVar2) * 0x401;
    uVar8 = uVar8 ^ uVar8 * 0x40 + 0x9e3779b9 + (uVar8 >> 2) +
                    (ulong)((uVar2 >> 2 ^ uVar2) * 0x81081);
    uVar9 = uVar9 >> 0x20;
    uVar6 = uVar6 - 0x20;
  } while (0x20 < uVar6);
  return uVar8;
}

Assistant:

inline std::size_t ComputeHashRaw(const void* pData, size_t Size) noexcept
{
    size_t Hash = 0;

    const auto* BytePtr  = static_cast<const Uint8*>(pData);
    const auto* EndPtr   = BytePtr + Size;
    const auto* DwordPtr = static_cast<const Uint32*>(AlignUp(pData, alignof(Uint32)));

    // Process initial bytes before we get to the 32-bit aligned pointer
    Uint64 Buffer = 0;
    Uint64 Shift  = 0;
    while (BytePtr < EndPtr && BytePtr < reinterpret_cast<const Uint8*>(DwordPtr))
    {
        Buffer |= Uint64{*(BytePtr++)} << Shift;
        Shift += 8;
    }
    VERIFY_EXPR(Shift <= 24);

    // Process dwords
    while (DwordPtr + 1 <= reinterpret_cast<const Uint32*>(EndPtr))
    {
        Buffer |= Uint64{*(DwordPtr++)} << Shift;
        HashCombine(Hash, static_cast<Uint32>(Buffer & ~Uint32{0}));
        Buffer = Buffer >> Uint64{32};
    }

    // Process the remaining bytes
    BytePtr = reinterpret_cast<const Uint8*>(DwordPtr);
    while (BytePtr < EndPtr)
    {
        Buffer |= Uint64{*(BytePtr++)} << Shift;
        Shift += 8;
    }
    VERIFY_EXPR(Shift <= (3 + 3) * 8);

    while (Shift != 0)
    {
        HashCombine(Hash, static_cast<Uint32>(Buffer & ~Uint32{0}));
        Buffer = Buffer >> Uint64{32};
        Shift -= (std::min)(Shift, Uint64{32});
    }

    return Hash;
}